

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function_set.cpp
# Opt level: O2

void __thiscall
duckdb::MapCastInfo::AddEntry
          (MapCastInfo *this,LogicalType *source,LogicalType *target,MapCastNode *node)

{
  _Map_base<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  _Map_base<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeIdEquality,_duckdb::LogicalTypeIdHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_01;
  _Hashtable<duckdb::LogicalType,std::pair<duckdb::LogicalType_const,duckdb::MapCastNode>,std::allocator<std::pair<duckdb::LogicalType_const,duckdb::MapCastNode>>,std::__detail::_Select1st,duckdb::LogicalTypeEquality,duckdb::LogicalTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var1;
  LogicalTypeId local_62;
  LogicalTypeId local_61;
  pair<duckdb::LogicalType,_duckdb::MapCastNode> local_60;
  
  local_61 = source->id_;
  this_00 = (_Map_base<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)::std::__detail::_Map_base<$5c4d8eca$>::operator[]
                         ((_Map_base<_5c4d8eca_> *)&this->casts,&local_61);
  this_01 = (_Map_base<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeIdEquality,_duckdb::LogicalTypeIdHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)::std::__detail::
               _Map_base<duckdb::LogicalType,_std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalType,_std::unordered_map<duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>,_duckdb::LogicalTypeIdHashFunction,_duckdb::LogicalTypeIdEquality,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeEquality,_duckdb::LogicalTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](this_00,source);
  local_62 = target->id_;
  p_Var1 = (_Hashtable<duckdb::LogicalType,std::pair<duckdb::LogicalType_const,duckdb::MapCastNode>,std::allocator<std::pair<duckdb::LogicalType_const,duckdb::MapCastNode>>,std::__detail::_Select1st,duckdb::LogicalTypeEquality,duckdb::LogicalTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            *)::std::__detail::
              _Map_base<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_std::unordered_map<duckdb::LogicalType,_duckdb::MapCastNode,_duckdb::LogicalTypeHashFunction,_duckdb::LogicalTypeEquality,_std::allocator<std::pair<const_duckdb::LogicalType,_duckdb::MapCastNode>_>_>_>_>,_std::__detail::_Select1st,_duckdb::LogicalTypeIdEquality,_duckdb::LogicalTypeIdHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[](this_01,&local_62);
  ::std::pair<duckdb::LogicalType,_duckdb::MapCastNode>::pair<duckdb::MapCastNode,_true>
            (&local_60,target,node);
  ::std::
  _Hashtable<duckdb::LogicalType,std::pair<duckdb::LogicalType_const,duckdb::MapCastNode>,std::allocator<std::pair<duckdb::LogicalType_const,duckdb::MapCastNode>>,std::__detail::_Select1st,duckdb::LogicalTypeEquality,duckdb::LogicalTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<duckdb::LogicalType,duckdb::MapCastNode>>(p_Var1,&local_60);
  ::std::pair<duckdb::LogicalType,_duckdb::MapCastNode>::~pair(&local_60);
  return;
}

Assistant:

void AddEntry(const LogicalType &source, const LogicalType &target, MapCastNode node) {
		casts[source.id()][source][target.id()].insert(make_pair(target, std::move(node)));
	}